

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,str_writer<char> *f)

{
  undefined8 *puVar1;
  long lVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  char *__dest;
  ulong uVar6;
  ptrdiff_t _Num_2;
  size_t size;
  char *pcVar7;
  ptrdiff_t _Num_3;
  ulong uVar8;
  fill_t<char> *fill;
  ulong uVar9;
  size_t sVar10;
  
  uVar9 = (ulong)(uint)specs->width;
  uVar8 = f->size_;
  uVar5 = uVar8;
  if (uVar9 != 0) {
    if (uVar8 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      uVar6 = 0;
      do {
        uVar5 = uVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
  }
  sVar10 = uVar9 - uVar5;
  if (uVar5 <= uVar9 && sVar10 != 0) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar8 = (specs->fill).size_ * sVar10 + uVar8 + lVar2;
    if ((ulong)puVar1[3] < uVar8) {
      (**(code **)*puVar1)(puVar1,uVar8);
    }
    puVar1[2] = uVar8;
    pcVar7 = (char *)(lVar2 + puVar1[1]);
    fill = &specs->fill;
    bVar4 = specs->field_0x9 & 0xf;
    if (bVar4 == 3) {
      pcVar7 = fill<char*,char>(pcVar7,sVar10 >> 1,fill);
      sVar3 = f->size_;
      if (sVar3 != 0) {
        memmove(pcVar7,f->s,sVar3);
      }
      pcVar7 = pcVar7 + sVar3;
      sVar10 = sVar10 - (sVar10 >> 1);
    }
    else {
      if (bVar4 == 2) {
        __dest = fill<char*,char>(pcVar7,sVar10,fill);
        sVar10 = f->size_;
        if (sVar10 == 0) {
          return;
        }
        pcVar7 = f->s;
        goto LAB_0012a6cd;
      }
      sVar3 = f->size_;
      if (sVar3 != 0) {
        memmove(pcVar7,f->s,sVar3);
      }
      pcVar7 = pcVar7 + sVar3;
    }
    fill<char*,char>(pcVar7,sVar10,fill);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar8 = uVar8 + lVar2;
  if ((ulong)puVar1[3] < uVar8) {
    (**(code **)*puVar1)(puVar1,uVar8);
  }
  puVar1[2] = uVar8;
  sVar10 = f->size_;
  if (sVar10 == 0) {
    return;
  }
  __dest = (char *)(lVar2 + puVar1[1]);
  pcVar7 = f->s;
LAB_0012a6cd:
  memmove(__dest,pcVar7,sVar10);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }